

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

double * __thiscall Graph::getTotalLoss(Graph *this)

{
  int iVar1;
  double *pdVar2;
  size_type sVar3;
  reference pvVar4;
  double dVar5;
  double lvl_loss;
  int i;
  double *total_loss;
  Graph *this_local;
  
  pdVar2 = (double *)operator_new__(0x10);
  *pdVar2 = 0.0;
  pdVar2[1] = 0.0;
  lvl_loss._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::size(&this->loads);
    if (sVar3 <= (ulong)(long)lvl_loss._4_4_) break;
    dVar5 = evaluateLossesAndFlows(this,1e-12,lvl_loss._4_4_);
    *pdVar2 = dVar5 * 100000.0 + *pdVar2;
    pvVar4 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                       (&this->loads,(long)lvl_loss._4_4_);
    iVar1 = pvVar4->time;
    pvVar4 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                       (&this->loads,(long)lvl_loss._4_4_);
    pdVar2[1] = dVar5 * 100000.0 * (double)iVar1 * pvVar4->cost + pdVar2[1];
    lvl_loss._4_4_ = lvl_loss._4_4_ + 1;
  }
  return pdVar2;
}

Assistant:

double * Graph::getTotalLoss(){
    double * total_loss = new double[2];
    total_loss[0] = 0.0;
    total_loss[1] = 0.0;
    for(int i = 0; i < this->loads.size() ; i++) {
        double lvl_loss = 100 * 1000 * this->evaluateLossesAndFlows(1e-12, i);
        total_loss[0] += lvl_loss;
        total_loss[1] += lvl_loss * this->loads[i].time * this->loads[i].cost;
    }
    return total_loss;
}